

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::encode_bits(symbol_codec *this,uint bits,uint num_bits)

{
  bool bVar1;
  uint in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  uint bits_00;
  
  if (in_EDX == 0) {
    return true;
  }
  bits_00 = (uint)((ulong)in_RDI >> 0x20);
  if (in_EDX < 0x11) {
    bVar1 = record_put_bits((symbol_codec *)CONCAT44(in_ESI,in_EDX),bits_00,(uint)in_RDI);
    if (!bVar1) {
      return false;
    }
  }
  else {
    bVar1 = record_put_bits((symbol_codec *)CONCAT44(in_ESI,in_EDX),bits_00,(uint)in_RDI);
    if (!bVar1) {
      return false;
    }
    bVar1 = record_put_bits((symbol_codec *)CONCAT44(in_ESI,in_EDX),(uint)((ulong)in_RDI >> 0x20),
                            (uint)in_RDI);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool symbol_codec::encode_bits(uint bits, uint num_bits)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      if (!num_bits)
         return true;

      LZHAM_ASSERT((num_bits == 32) || (bits <= ((1U << num_bits) - 1)));

      if (num_bits > 16)
      {
         if (!record_put_bits(bits >> 16, num_bits - 16))
            return false;
         if (!record_put_bits(bits & 0xFFFF, 16))
            return false;
      }
      else
      {
         if (!record_put_bits(bits, num_bits))
            return false;
      }
      return true;
   }